

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O1

bool __thiscall
SslUdpSocketImpl::CreateClientSide
          (SslUdpSocketImpl *this,char *szIpToWhere,uint16_t sPort,char *szDestAddr,char *szIpToBind
          )

{
  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
  *this_00;
  mutex *__mutex;
  atomic<unsigned_long> *paVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  SslConnection *pSVar6;
  size_t __n;
  long *szBuffer;
  wstring *pwVar7;
  SSL *pSVar8;
  undefined8 uVar9;
  pointer __p;
  bool bVar10;
  unique_lock<std::mutex> lock;
  size_t len;
  __array temp;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  _Any_data *local_d8;
  long local_d0;
  _Any_data local_c8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_b8;
  _Head_base<0UL,_unsigned_char_*,_false> local_98 [2];
  long local_88 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_70;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar2 = (char *)(this->m_strDestAddr)._M_string_length;
  strlen(szDestAddr);
  local_78 = &this->m_strDestAddr;
  std::__cxx11::string::_M_replace((ulong)&this->m_strDestAddr,0,pcVar2,(ulong)szDestAddr);
  bVar3 = UdpSocketImpl::Create(&this->super_UdpSocketImpl,szIpToWhere,sPort,szIpToBind);
  if (!bVar3) {
    return bVar3;
  }
  pSVar6 = (SslConnection *)operator_new(0x70);
  OpenSSLWrapper::SslConnection::SslConnection(pSVar6,&(this->m_pUdpCtx).super_SslContext);
  this_00 = &this->m_pSslCon;
  local_f8._M_unused._M_object = (void *)0x0;
  std::
  __uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
  ::reset((__uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           *)this_00,pSVar6);
  std::
  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
  ~unique_ptr((unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               *)&local_f8);
  pSVar6 = (this->m_pSslCon)._M_t.
           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ._M_t.
           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl;
  local_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_f8._M_unused._M_object = operator_new(0x18);
  *(code **)local_f8._M_unused._0_8_ = (code *)0x11;
  *(code **)((long)local_f8._M_unused._0_8_ + 8) = (code *)0x0;
  *(SslUdpSocketImpl **)((long)local_f8._M_unused._0_8_ + 0x10) = this;
  pcStack_e0 = std::
               _Function_handler<void_(),_std::_Bind<void_(BaseSocketImpl::*(SslUdpSocketImpl_*))()>_>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_std::_Bind<void_(BaseSocketImpl::*(SslUdpSocketImpl_*))()>_>
             ::_M_manager;
  OpenSSLWrapper::SslConnection::SetErrorCb(pSVar6,(function<void_()> *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  OpenSSLWrapper::SslConnection::SSLSetConnectState
            ((this_00->_M_t).
             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ._M_t.
             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
  iVar4 = OpenSSLWrapper::SslConnection::SSLDoHandshake
                    ((this_00->_M_t).
                     super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                     .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
  if ((0 < iVar4) ||
     (uVar5 = OpenSSLWrapper::SslConnection::SSLGetError
                        ((this_00->_M_t).
                         super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl
                         ,iVar4), uVar5 == 2)) {
    local_f8._M_unused._M_object = &this->m_mxEnDecode;
    local_f8._8_8_ = local_f8._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_f8);
    local_f8._M_pod_data[8] = 1;
    __n = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                    ((this->m_pSslCon)._M_t.
                     super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                     .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
    if (__n == 0) {
      bVar10 = false;
    }
    else {
      __mutex = &(this->super_UdpSocketImpl).m_mxOutDeque;
      bVar10 = false;
      do {
        szBuffer = (long *)operator_new__(__n);
        memset(szBuffer,0,__n);
        local_98[0]._M_head_impl = (uchar *)szBuffer;
        local_d8 = (_Any_data *)
                   OpenSSLWrapper::SslConnection::SslGetOutData
                             ((this_00->_M_t).
                              super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                              .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                              _M_head_impl,(uint8_t *)szBuffer,__n);
        if (local_d8 != (_Any_data *)0x0) {
          iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
          if (iVar4 != 0) {
            std::__throw_system_error(iVar4);
          }
          LOCK();
          paVar1 = &(this->super_UdpSocketImpl).m_atOutBytes;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (__int_type)
               (local_d8->_M_pod_data + (paVar1->super___atomic_base<unsigned_long>)._M_i);
          UNLOCK();
          std::
          deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
          ::
          emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&,std::__cxx11::string&>
                    ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                      *)&(this->super_UdpSocketImpl).m_quOutData,
                     (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)local_98,
                     (unsigned_long *)&local_d8,local_78);
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          bVar10 = true;
        }
        __n = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                        ((this_00->_M_t).
                         super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl
                        );
        if ((long *)local_98[0]._M_head_impl != (long *)0x0) {
          operator_delete__(local_98[0]._M_head_impl);
        }
      } while (__n != 0);
    }
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&local_f8);
    if (bVar10) {
      UdpSocketImpl::TriggerWriteThread(&this->super_UdpSocketImpl);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_f8);
    return bVar3;
  }
  (this->super_UdpSocketImpl).super_BaseSocketImpl.m_iError = uVar5 | 0x80000000;
  (this->super_UdpSocketImpl).super_BaseSocketImpl.m_iErrLoc = 0xf;
  __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
            (&local_70,vswprintf,0x10,L"%d",(ulong)uVar5);
  pwVar7 = (wstring *)std::__cxx11::wstring::replace((ulong)&local_70,0,(wchar_t *)0x0,0x13446c);
  std::__cxx11::wstring::wstring((wstring *)local_50,pwVar7);
  pwVar7 = (wstring *)std::__cxx11::wstring::append((wchar_t *)local_50);
  std::__cxx11::wstring::wstring((wstring *)&local_d8,pwVar7);
  pSVar8 = OpenSSLWrapper::SslConnection::operator()
                     ((this_00->_M_t).
                      super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                      .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
  __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>(&local_b8,vswprintf,0x20,L"%lu",pSVar8);
  uVar9 = (void *)0x3;
  if (local_d8 != &local_c8) {
    uVar9 = local_c8._M_unused._0_8_;
  }
  if ((ulong)uVar9 < (void *)(local_b8._M_string_length + local_d0)) {
    uVar9 = (void *)0x3;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      uVar9 = local_b8.field_2._M_allocated_capacity;
    }
    if ((void *)(local_b8._M_string_length + local_d0) <= (ulong)uVar9) {
      pwVar7 = (wstring *)
               std::__cxx11::wstring::replace((ulong)&local_b8,0,(wchar_t *)0x0,(ulong)local_d8);
      goto LAB_00112caa;
    }
  }
  pwVar7 = (wstring *)
           std::__cxx11::wstring::_M_append((wchar_t *)&local_d8,(ulong)local_b8._M_dataplus._M_p);
LAB_00112caa:
  std::__cxx11::wstring::wstring((wstring *)local_98,pwVar7);
  pwVar7 = (wstring *)std::__cxx11::wstring::append((wchar_t *)local_98);
  std::__cxx11::wstring::wstring((wstring *)local_f8._M_pod_data,pwVar7);
  OutputDebugString((wchar_t *)local_f8._M_unused._0_8_);
  if ((code **)local_f8._M_unused._0_8_ != &local_e8) {
    operator_delete(local_f8._M_unused._M_object,(long)local_e8 * 4 + 4);
  }
  if ((long *)local_98[0]._M_head_impl != local_88) {
    operator_delete(local_98[0]._M_head_impl,local_88[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8._M_unused._M_member_pointer * 4 + 4);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
  }
  (*(this->super_UdpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl[2])(this);
  return false;
}

Assistant:

bool SslUdpSocketImpl::CreateClientSide(const char* const szIpToWhere, const uint16_t sPort, const char* const szDestAddr, const char* const szIpToBind/* = nullptr*/)
{
    m_strDestAddr = szDestAddr;
    const bool bRet = UdpSocketImpl::Create(szIpToWhere, sPort, szIpToBind);
    if (bRet == true)
    {
        m_pSslCon = make_unique<SslConnection>(m_pUdpCtx);
        m_pSslCon->SetErrorCb(function<void()>(bind(&BaseSocketImpl::Close, this)));

        //SSL_set_info_callback((*m_pSslCon)(), ssl_info_callbackClient);

        m_pSslCon->SSLSetConnectState();

        const int iSslInit = m_pSslCon->SSLDoHandshake();
        if (iSslInit <= 0)
        {
            const int iError = m_pSslCon->SSLGetError(iSslInit);
            if (iError != SSL_ERROR_WANT_READ)
            {
                m_iError = 0x80000000 | iError;
                m_iErrLoc = 15;
                OutputDebugString(wstring(L"SSL_error after SSL_Handshake: " + to_wstring(iError) + L" on ssl context: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)())) + L"\r\n").c_str());
                Close();
                return false;
            }
        }

        unique_lock<mutex> lock(m_mxEnDecode);
        bool bNewData = false;

        size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
        while (nOutDataSize > 0)
        {
            auto temp = make_unique<uint8_t[]>(nOutDataSize);
            size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
            // Schreibt Daten in die SOCKET
            if (len > 0)
            {
                m_mxOutDeque.lock();
                m_atOutBytes += len;
                m_quOutData.emplace_back(move(temp), len, m_strDestAddr);
                m_mxOutDeque.unlock();
                bNewData = true;
            }
            nOutDataSize = m_pSslCon->SslGetOutDataSize();
        }

        lock.unlock();

        if (bNewData == true)
            TriggerWriteThread();

    }
    return bRet;
}